

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AttributeRelativeOffsetCase::test
          (AttributeRelativeOffsetCase *this,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum GVar5;
  uint uVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar9;
  long *plVar10;
  undefined4 extraout_var_01;
  size_type *psVar11;
  int attr;
  uint uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ScopedLogSection section;
  GLint maxAttrs;
  ScopedLogSection section_1;
  CallLogWrapper gl;
  VertexArray otherVao;
  VertexArray vao;
  ScopedLogSection local_148;
  long local_140;
  TestLog local_138;
  long lStack_130;
  string local_128;
  string local_108;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  string local_c8;
  ResultCollector *local_a8;
  uint local_9c;
  ScopedLogSection local_98;
  CallLogWrapper local_90;
  code *local_78;
  GLenum local_70;
  ObjectWrapper local_68;
  AttributeRelativeOffsetCase *local_50;
  ObjectWrapper local_48;
  
  local_a8 = result;
  iVar4 = (*((this->super_AttributeCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_90,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  iVar4 = (*((this->super_AttributeCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_48,(Functions *)CONCAT44(extraout_var_00,iVar4),pOVar9);
  local_9c = 0xffffffff;
  local_90.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&local_90,local_48.m_object);
  glu::CallLogWrapper::glGetIntegerv(&local_90,0x8869,(GLint *)&local_9c);
  GVar5 = glu::CallLogWrapper::glGetError(&local_90);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_68.m_gl = (Functions *)glu::getErrorName;
    local_68.m_traits._0_4_ = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_68);
    uVar13 = 0xf;
    if (local_e8 != local_d8) {
      uVar13 = local_d8[0];
    }
    if (uVar13 < local_c8._M_string_length + local_e0) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar14 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_c8._M_string_length + local_e0) goto LAB_01567dfd;
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_01567dfd:
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_148.m_log = &local_138;
    pTVar3 = (TestLog *)(plVar10 + 2);
    if ((TestLog *)*plVar10 == pTVar3) {
      local_138.m_log = pTVar3->m_log;
      lStack_130 = plVar10[3];
    }
    else {
      local_138.m_log = pTVar3->m_log;
      local_148.m_log = (TestLog *)*plVar10;
    }
    local_140 = plVar10[1];
    *plVar10 = (long)pTVar3;
    plVar10[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128.field_2._8_8_ = plVar10[3];
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_128._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108.field_2._8_8_ = plVar10[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_108._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::ResultCollector::fail(local_a8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148.m_log != &local_138) {
      operator_delete(local_148.m_log,(ulong)((long)&(local_138.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  pTVar3 = ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"initial","");
  paVar2 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Initial values","");
  tcu::ScopedLogSection::ScopedLogSection(&local_148,pTVar3,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  uVar12 = 0;
  do {
    deqp::gls::StateQueryUtil::verifyStateAttributeInteger
              (local_a8,&local_90,0x82d5,uVar12,0,(this->super_AttributeCase).m_verifier);
    uVar12 = uVar12 + 1;
    uVar6 = local_9c;
    if ((int)local_9c < 0x11) {
      uVar6 = 0x10;
    }
  } while (uVar12 < uVar6);
  tcu::TestLog::endSection(local_148.m_log);
  pTVar3 = ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"vao","");
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"VAO state","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*((this->super_AttributeCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_68,(Functions *)CONCAT44(extraout_var_01,iVar4),pOVar9);
  glu::CallLogWrapper::glVertexAttribFormat(&local_90,1,4,0x1406,'\0',9);
  GVar5 = glu::CallLogWrapper::glGetError(&local_90);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_78 = glu::getErrorName;
    local_70 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_78);
    uVar13 = 0xf;
    if (local_e8 != local_d8) {
      uVar13 = local_d8[0];
    }
    if (uVar13 < local_c8._M_string_length + local_e0) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar14 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_c8._M_string_length + local_e0) goto LAB_015681fb;
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_015681fb:
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_148.m_log = &local_138;
    pTVar3 = (TestLog *)(plVar10 + 2);
    if ((TestLog *)*plVar10 == pTVar3) {
      local_138.m_log = pTVar3->m_log;
      lStack_130 = plVar10[3];
    }
    else {
      local_138.m_log = pTVar3->m_log;
      local_148.m_log = (TestLog *)*plVar10;
    }
    local_140 = plVar10[1];
    *plVar10 = (long)pTVar3;
    plVar10[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128.field_2._8_8_ = plVar10[3];
      local_128._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_128._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108.field_2._8_8_ = plVar10[3];
      local_108._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_108._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::ResultCollector::fail(local_a8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148.m_log != &local_138) {
      operator_delete(local_148.m_log,(ulong)((long)&(local_138.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(&local_90,local_68.m_object);
  GVar5 = glu::CallLogWrapper::glGetError(&local_90);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_78 = glu::getErrorName;
    local_70 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_78);
    uVar13 = 0xf;
    if (local_e8 != local_d8) {
      uVar13 = local_d8[0];
    }
    if (uVar13 < local_c8._M_string_length + local_e0) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar14 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_c8._M_string_length + local_e0) goto LAB_01568454;
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_01568454:
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_148.m_log = &local_138;
    pTVar3 = (TestLog *)(plVar10 + 2);
    if ((TestLog *)*plVar10 == pTVar3) {
      local_138.m_log = pTVar3->m_log;
      lStack_130 = plVar10[3];
    }
    else {
      local_138.m_log = pTVar3->m_log;
      local_148.m_log = (TestLog *)*plVar10;
    }
    local_140 = plVar10[1];
    *plVar10 = (long)pTVar3;
    plVar10[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128.field_2._8_8_ = plVar10[3];
      local_128._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_128._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108.field_2._8_8_ = plVar10[3];
      local_108._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_108._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::ResultCollector::fail(local_a8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148.m_log != &local_138) {
      operator_delete(local_148.m_log,(ulong)((long)&(local_138.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  glu::CallLogWrapper::glVertexAttribFormat(&local_90,1,4,0x1406,'\0',0x15);
  GVar5 = glu::CallLogWrapper::glGetError(&local_90);
  if (GVar5 != 0) {
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
    local_78 = glu::getErrorName;
    local_70 = GVar5;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_78);
    uVar13 = 0xf;
    if (local_e8 != local_d8) {
      uVar13 = local_d8[0];
    }
    if (uVar13 < local_c8._M_string_length + local_e0) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar14 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_c8._M_string_length + local_e0) goto LAB_015686be;
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_015686be:
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_148.m_log = &local_138;
    pTVar3 = (TestLog *)(plVar10 + 2);
    if ((TestLog *)*plVar10 == pTVar3) {
      local_138.m_log = pTVar3->m_log;
      lStack_130 = plVar10[3];
    }
    else {
      local_138.m_log = pTVar3->m_log;
      local_148.m_log = (TestLog *)*plVar10;
    }
    local_140 = plVar10[1];
    *plVar10 = (long)pTVar3;
    plVar10[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128.field_2._8_8_ = plVar10[3];
      local_128._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar11;
      local_128._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_128._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108.field_2._8_8_ = plVar10[3];
      local_108._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_108._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    tcu::ResultCollector::fail(local_a8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_148.m_log != &local_138) {
      operator_delete(local_148.m_log,(ulong)((long)&(local_138.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  glu::CallLogWrapper::glBindVertexArray(&local_90,local_48.m_object);
  GVar5 = glu::CallLogWrapper::glGetError(&local_90);
  if (GVar5 == 0) goto LAB_01568ab8;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
  local_78 = glu::getErrorName;
  local_70 = GVar5;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_78);
  uVar13 = 0xf;
  if (local_e8 != local_d8) {
    uVar13 = local_d8[0];
  }
  if (uVar13 < local_c8._M_string_length + local_e0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar14 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_c8._M_string_length + local_e0) goto LAB_01568917;
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_01568917:
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
  }
  local_148.m_log = &local_138;
  pTVar3 = (TestLog *)(plVar10 + 2);
  if ((TestLog *)*plVar10 == pTVar3) {
    local_138.m_log = pTVar3->m_log;
    lStack_130 = plVar10[3];
  }
  else {
    local_138.m_log = pTVar3->m_log;
    local_148.m_log = (TestLog *)*plVar10;
  }
  local_140 = plVar10[1];
  *plVar10 = (long)pTVar3;
  plVar10[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
  psVar11 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_128.field_2._M_allocated_capacity = *psVar11;
    local_128.field_2._8_8_ = plVar10[3];
    local_128._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar11;
    local_128._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_128._M_string_length = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
  psVar11 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_108.field_2._M_allocated_capacity = *psVar11;
    local_108.field_2._8_8_ = plVar10[3];
    local_108._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar11;
    local_108._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_108._M_string_length = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::ResultCollector::fail(local_a8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_148.m_log != &local_138) {
    operator_delete(local_148.m_log,(ulong)((long)&(local_138.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
LAB_01568ab8:
  deqp::gls::StateQueryUtil::verifyStateAttributeInteger
            (local_a8,&local_90,0x82d5,1,9,(this->super_AttributeCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&local_68);
  tcu::TestLog::endSection(local_98.m_log);
  pTVar3 = ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"random","");
  local_128._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Random values","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_108,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_50 = this;
  deRandom_init((deRandom *)&local_68,0xabc);
  iVar4 = 10;
  do {
    uVar12 = local_9c;
    dVar7 = deRandom_getUint32((deRandom *)&local_68);
    if ((int)uVar12 < 0x11) {
      uVar12 = 0x10;
    }
    dVar8 = deRandom_getUint32((deRandom *)&local_68);
    glu::CallLogWrapper::glVertexAttribFormat(&local_90,dVar7 % uVar12,4,0x1406,'\0',dVar8 & 0x7ff);
    GVar5 = glu::CallLogWrapper::glGetError(&local_90);
    if (GVar5 != 0) {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Got Error ","");
      local_78 = glu::getErrorName;
      local_70 = GVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_c8,&local_78);
      uVar13 = 0xf;
      if (local_e8 != local_d8) {
        uVar13 = local_d8[0];
      }
      if (uVar13 < local_c8._M_string_length + local_e0) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          uVar14 = local_c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_c8._M_string_length + local_e0) goto LAB_01568caf;
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_01568caf:
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
      }
      local_148.m_log = &local_138;
      pTVar3 = (TestLog *)(plVar10 + 2);
      if ((TestLog *)*plVar10 == pTVar3) {
        local_138.m_log = pTVar3->m_log;
        lStack_130 = plVar10[3];
      }
      else {
        local_138.m_log = pTVar3->m_log;
        local_148.m_log = (TestLog *)*plVar10;
      }
      local_140 = plVar10[1];
      *plVar10 = (long)pTVar3;
      plVar10[1] = 0;
      *(undefined1 *)&pTVar3->m_log = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      psVar11 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_128.field_2._M_allocated_capacity = *psVar11;
        local_128.field_2._8_8_ = plVar10[3];
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar11;
        local_128._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_128._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar11 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_108.field_2._M_allocated_capacity = *psVar11;
        local_108.field_2._8_8_ = plVar10[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar11;
        local_108._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_108._M_string_length = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      tcu::ResultCollector::fail(local_a8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_148.m_log != &local_138) {
        operator_delete(local_148.m_log,(ulong)((long)&(local_138.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
    }
    deqp::gls::StateQueryUtil::verifyStateAttributeInteger
              (local_a8,&local_90,0x82d5,dVar7 % uVar12,dVar8 & 0x7ff,
               (local_50->super_AttributeCase).m_verifier);
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      tcu::TestLog::endSection(local_98.m_log);
      glu::ObjectWrapper::~ObjectWrapper(&local_48);
      glu::CallLogWrapper::~CallLogWrapper(&local_90);
      return;
    }
  } while( true );
}

Assistant:

void AttributeRelativeOffsetCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao			(m_context.getRenderContext());
	glw::GLint			maxAttrs	= -1;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxAttrs);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int attr = 0; attr < de::max(16, maxAttrs); ++attr)
			verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, attr, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glVertexAttribFormat(1, 4, GL_FLOAT, GL_FALSE, 9);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		gl.glVertexAttribFormat(1, 4, GL_FLOAT, GL_FALSE, 21);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 1, 9, m_verifier);
	}

	// random values
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0xabc);
		const int					numRandomTests	= 10;

		for (int randomTestNdx = 0; randomTestNdx < numRandomTests; ++randomTestNdx)
		{
			const int	va				= rnd.getInt(0, de::max(16, maxAttrs)-1);
			const int	offset			= rnd.getInt(0, 2047);

			gl.glVertexAttribFormat(va, 4, GL_FLOAT, GL_FALSE, offset);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

			verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, va, offset, m_verifier);
		}
	}
}